

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zexpand(stbi__zbuf *z,char *zout,int n)

{
  int iVar1;
  char *pcVar2;
  int local_38;
  int limit;
  int cur;
  char *q;
  int n_local;
  char *zout_local;
  stbi__zbuf *z_local;
  
  z->zout = zout;
  if (z->z_expandable == 0) {
    z_local._4_4_ = stbi__err("output buffer limit");
  }
  else {
    iVar1 = (int)z->zout - (int)z->zout_start;
    for (local_38 = (int)z->zout_end - (int)z->zout_start; local_38 < iVar1 + n;
        local_38 = local_38 << 1) {
    }
    pcVar2 = (char *)realloc(z->zout_start,(long)local_38);
    if (pcVar2 == (char *)0x0) {
      z_local._4_4_ = stbi__err("outofmem");
    }
    else {
      z->zout_start = pcVar2;
      z->zout = pcVar2 + iVar1;
      z->zout_end = pcVar2 + local_38;
      z_local._4_4_ = 1;
    }
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__zexpand(stbi__zbuf *z, char *zout, int n)  // need to make room for n bytes
{
   char *q;
   int cur, limit;
   z->zout = zout;
   if (!z->z_expandable) return stbi__err("output buffer limit","Corrupt PNG");
   cur   = (int) (z->zout     - z->zout_start);
   limit = (int) (z->zout_end - z->zout_start);
   while (cur + n > limit)
      limit *= 2;
   q = (char *) STBI_REALLOC(z->zout_start, limit);
   if (q == NULL) return stbi__err("outofmem", "Out of memory");
   z->zout_start = q;
   z->zout       = q + cur;
   z->zout_end   = q + limit;
   return 1;
}